

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

float fastsinrc(float x)

{
  float fVar1;
  undefined4 local_c;
  float x_local;
  
  local_c = fmodf(x,6.2831855);
  if (local_c <= 4.712389) {
    if (1.5707964 < local_c) {
      local_c = 3.1415927 - local_c;
    }
  }
  else {
    local_c = local_c - 6.2831855;
  }
  fVar1 = fastsin(local_c);
  return fVar1;
}

Assistant:

static float fastsinrc(float x)
{
    // @@@BUG
    // NB this range reduction really only works for values >=0,
    // yet FM-sine oscillators will also pass in negative values.
    // This is not a good idea. At all. But it's what the original
    // V2 code does. :)

    // first range reduction: mod with 2pi
    x = fmodf(x, fc2pi);
    // now x in [-2pi,2pi]

#if !BUG_V2_FM_RANGE
    if (x < 0.0f)
        x += fc2pi;
#endif

    // need to reduce to [-pi/2, pi/2] to call fastsin
    if (x > fc1p5pi) // x in (3pi/2,2pi]
        x -= fc2pi; // sin(x) = sin(x-2pi)
    else if (x > fcpi_2) // x in (pi/2,3pi/2]
        x = fcpi - x; // sin(x) = -sin(x-pi) = sin(-(x-pi)) = sin(pi-x)

    return fastsin(x);
}